

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

void Abc_SclUpsizeRemoveDangling(SC_Man *p,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *p_00;
  SC_Cell *pSVar1;
  int i;
  
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    p_00 = Abc_NtkObj(pNtk,i);
    if ((((p_00 != (Abc_Obj_t *)0x0) && ((*(uint *)&p_00->field_0x14 & 0xf) == 7)) &&
        ((p_00->pNtk->ntkFunc != ABC_FUNC_MAP ||
         (((p_00->vFanins).nSize != 1 || ((p_00->field_5).pData != (void *)0x0)))))) &&
       ((p_00->vFanouts).nSize == 0)) {
      pSVar1 = Abc_SclObjCell(p_00);
      p->SumArea = p->SumArea - pSVar1->area;
      Abc_NtkDeleteObj_rec(p_00,1);
    }
  }
  return;
}

Assistant:

void Abc_SclUpsizeRemoveDangling( SC_Man * p, Abc_Ntk_t * pNtk )
{
    SC_Cell * pCell;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) == 0 )
        {
            pCell = Abc_SclObjCell( pObj );
            p->SumArea -= pCell->area;
            Abc_NtkDeleteObj_rec( pObj, 1 );
//            printf( "Removed node %d.\n", i );
        }
}